

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  float *pfVar6;
  float *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  bool bVar7;
  bool bVar8;
  float in_XMM0_Da;
  float axis_00;
  float fVar9;
  float fVar10;
  float lhs;
  float fVar11;
  float fVar12;
  float in_XMM1_Da;
  undefined8 *in_stack_00000008;
  float grab_pos_1;
  float grab_t_1;
  float v_new_1;
  float new_clicked_t;
  float v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  bool tweak_fast;
  bool tweak_slow;
  float input_delta;
  bool clicked_around_grab;
  float grab_pos;
  float grab_t;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  float v_range;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float local_104;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float fVar13;
  char cVar14;
  float in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  float local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  float local_bc;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  undefined4 uVar15;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  bool local_71;
  float local_58;
  
  pIVar3 = GImGui;
  uVar5 = (uint)((in_R9D & 0x100000) != 0);
  bVar7 = in_EDX == 8;
  bVar8 = in_EDX == 9;
  if (in_XMM1_Da <= in_XMM0_Da) {
    local_e8 = in_XMM0_Da - in_XMM1_Da;
  }
  else {
    local_e8 = in_XMM1_Da - in_XMM0_Da;
  }
  axis_00 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar5);
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar5);
  fVar9 = (axis_00 - fVar9) - 4.0;
  local_58 = (pIVar3->Style).GrabMinSize;
  local_104 = in_stack_ffffffffffffff6c;
  if ((!bVar7 && !bVar8) && (0.0 <= local_e8)) {
    local_58 = ImMax<float>(fVar9 / (local_e8 + 1.0),(pIVar3->Style).GrabMinSize);
    local_104 = in_stack_ffffffffffffff6c;
  }
  fVar10 = ImMin<float>(local_58,fVar9);
  lhs = fVar9 - fVar10;
  fVar11 = ImVec2::operator[](in_RDI,(long)(int)uVar5);
  fVar11 = fVar10 * 0.5 + fVar11 + 2.0;
  fVar12 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar5);
  fVar12 = -fVar10 * 0.5 + (fVar12 - 2.0);
  if ((in_R9D & 0x20) != 0) {
    if (bVar7 || bVar8) {
      in_stack_ffffffffffffff10 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                      (int)in_stack_ffffffffffffff04);
    }
    else {
      in_stack_ffffffffffffff10 = 1;
    }
    ImPow(0.0,7.486143e-39);
    in_stack_ffffffffffffff0c = (pIVar3->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(lhs,1.0);
  }
  local_71 = false;
  if (pIVar3->ActiveId == in_ESI) {
    bVar2 = false;
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar3->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar6 = ImVec2::operator[](&(pIVar3->IO).MousePos,(long)(int)uVar5);
        fVar1 = *pfVar6;
        fVar13 = in_stack_ffffffffffffff08;
        if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
          in_stack_ffffffffffffff80 =
               ScaleRatioFromValueT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                          SUB41((uint)in_stack_ffffffffffffff50 >> 0x18,0),in_stack_ffffffffffffff4c
                          ,in_stack_ffffffffffffff48);
          if (uVar5 == 1) {
            in_stack_ffffffffffffff80 = 1.0 - in_stack_ffffffffffffff80;
          }
          in_stack_ffffffffffffff7c = ImLerp<float>(fVar11,fVar12,in_stack_ffffffffffffff80);
          fVar13 = (float)((uint)in_stack_ffffffffffffff08 & 0xffffff);
          if ((-fVar10 * 0.5 + in_stack_ffffffffffffff7c) - 1.0 <= fVar1) {
            fVar13 = (float)CONCAT13(fVar1 <= fVar10 * 0.5 + in_stack_ffffffffffffff7c + 1.0,
                                     SUB43(in_stack_ffffffffffffff08,0));
          }
          cVar14 = (char)((uint)fVar13 >> 0x18);
          in_stack_ffffffffffffff78 = (float)CONCAT13(cVar14,SUB43(in_stack_ffffffffffffff78,0));
          if ((cVar14 == '\0') || (!bVar7 && !bVar8)) {
            in_stack_ffffffffffffff04 = 0.0;
          }
          else {
            in_stack_ffffffffffffff04 = fVar1 - in_stack_ffffffffffffff7c;
          }
          pIVar3->SliderGrabClickOffset = in_stack_ffffffffffffff04;
        }
        if (0.0 < lhs) {
          ImSaturate(((fVar1 - pIVar3->SliderGrabClickOffset) - fVar11) / lhs);
        }
        bVar2 = true;
        in_stack_ffffffffffffff08 = fVar13;
      }
    }
    else if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar3->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar3->SliderCurrentAccum = 0.0;
        pIVar3->SliderCurrentAccumDirty = false;
      }
      if (uVar5 == 0) {
        in_stack_ffffffffffffff00 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
      }
      else {
        in_stack_ffffffffffffff00 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
        in_stack_ffffffffffffff00 = -in_stack_ffffffffffffff00;
      }
      if ((in_stack_ffffffffffffff00 != 0.0) ||
         (in_stack_ffffffffffffff74 = in_stack_ffffffffffffff00, NAN(in_stack_ffffffffffffff00))) {
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff00;
        bVar4 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        uVar15 = CONCAT13(bVar4,SUB43(in_stack_ffffffffffffff70,0));
        bVar4 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        in_stack_ffffffffffffff70 =
             (float)CONCAT13((char)((uint)uVar15 >> 0x18),CONCAT12(bVar4,(short)uVar15));
        if (bVar7 || bVar8) {
          local_104 = (float)ImParseFormatPrecision
                                       ((char *)CONCAT44(in_stack_ffffffffffffff0c,
                                                         in_stack_ffffffffffffff08),
                                        (int)in_stack_ffffffffffffff04);
        }
        else {
          local_104 = 0.0;
        }
        if ((int)local_104 < 1) {
          if (((-100.0 <= local_e8) && (local_e8 <= 100.0)) ||
             (((uint)in_stack_ffffffffffffff70 & 0x1000000) != 0)) {
            in_stack_ffffffffffffff74 =
                 (float)(~-(uint)(in_stack_ffffffffffffff74 < 0.0) & 0x3f800000 |
                        -(uint)(in_stack_ffffffffffffff74 < 0.0) & 0xbf800000) / local_e8;
          }
          else {
            in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 / 100.0;
          }
        }
        else {
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 / 100.0;
          if (((uint)in_stack_ffffffffffffff70 & 0x1000000) != 0) {
            in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 / 10.0;
          }
        }
        if (((uint)in_stack_ffffffffffffff70 & 0x10000) != 0) {
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 * 10.0;
        }
        pIVar3->SliderCurrentAccum = in_stack_ffffffffffffff74 + pIVar3->SliderCurrentAccum;
        pIVar3->SliderCurrentAccumDirty = true;
      }
      in_stack_ffffffffffffff68 = pIVar3->SliderCurrentAccum;
      if ((pIVar3->NavActivatePressedId == in_ESI) && ((pIVar3->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar3->SliderCurrentAccumDirty & 1U) != 0) {
        fVar10 = ScaleRatioFromValueT<float,float,float>
                           ((ImGuiDataType)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                            in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                            SUB41((uint)in_stack_ffffffffffffff50 >> 0x18,0),
                            in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
        if (((1.0 <= fVar10) && (0.0 < in_stack_ffffffffffffff68)) ||
           ((fVar10 <= 0.0 && (in_stack_ffffffffffffff68 < 0.0)))) {
          bVar2 = false;
          pIVar3->SliderCurrentAccum = 0.0;
        }
        else {
          bVar2 = true;
          ImSaturate(fVar10 + in_stack_ffffffffffffff68);
          in_stack_ffffffffffffff60 =
               ScaleValueFromRatioT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                          SUB41((uint)in_stack_ffffffffffffff70 >> 0x18,0),local_104,
                          in_stack_ffffffffffffff68);
          if ((bVar7 || bVar8) && ((in_R9D & 0x40) == 0)) {
            in_stack_ffffffffffffff60 =
                 RoundScalarWithFormatT<float>
                           ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            (ImGuiDataType)in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
          }
          in_stack_ffffffffffffff5c =
               ScaleRatioFromValueT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                          SUB41((uint)in_stack_ffffffffffffff50 >> 0x18,0),in_stack_ffffffffffffff4c
                          ,in_stack_ffffffffffffff48);
          if (in_stack_ffffffffffffff68 <= 0.0) {
            fVar10 = ImMax<float>(in_stack_ffffffffffffff5c - fVar10,in_stack_ffffffffffffff68);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar10;
          }
          else {
            fVar10 = ImMin<float>(in_stack_ffffffffffffff5c - fVar10,in_stack_ffffffffffffff68);
            pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar10;
          }
        }
        pIVar3->SliderCurrentAccumDirty = false;
      }
    }
    if (bVar2) {
      in_stack_ffffffffffffff58 =
           ScaleValueFromRatioT<float,float,float>
                     ((ImGuiDataType)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                      in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                      SUB41((uint)in_stack_ffffffffffffff70 >> 0x18,0),local_104,
                      in_stack_ffffffffffffff68);
      if ((bVar7 || bVar8) && ((in_R9D & 0x40) == 0)) {
        in_stack_ffffffffffffff58 =
             RoundScalarWithFormatT<float>
                       ((char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (ImGuiDataType)in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      }
      if ((*in_RCX != in_stack_ffffffffffffff58) || (NAN(*in_RCX) || NAN(in_stack_ffffffffffffff58))
         ) {
        *in_RCX = in_stack_ffffffffffffff58;
        local_71 = true;
      }
    }
  }
  if (1.0 <= fVar9) {
    local_bc = ScaleRatioFromValueT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                          SUB41((uint)in_stack_ffffffffffffff50 >> 0x18,0),in_stack_ffffffffffffff4c
                          ,in_stack_ffffffffffffff48);
    if (uVar5 == 1) {
      local_bc = 1.0 - local_bc;
    }
    ImLerp<float>(fVar11,fVar12,local_bc);
    if (uVar5 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c
                     ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
      ;
      *in_stack_00000008 = local_d0;
      in_stack_00000008[1] = local_c8;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c
                     ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
      ;
      *in_stack_00000008 = local_e0;
      in_stack_00000008[1] = local_d8;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff48,in_RDI,in_RDI);
    *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    in_stack_00000008[1] = CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
  }
  return local_71;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}